

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__decode_half_float_linear_ABGR(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 (*pauVar6) [16];
  short *psVar7;
  float *decode;
  float *pfVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  undefined2 uVar18;
  undefined2 uVar19;
  int iVar20;
  ushort uVar21;
  int iVar22;
  undefined2 uVar23;
  undefined2 uVar24;
  undefined2 uVar26;
  undefined1 auVar13 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar25;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar5 = _DAT_005ecc00;
  auVar4 = _DAT_005ce310;
  pfVar1 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    if (3 < width_times_channels) {
      pfVar8 = decodep + 4;
      psVar7 = (short *)((long)inputp + 6);
      do {
        fVar9 = (float)(((int)*psVar7 & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar9 | 0x7f800000);
        if (fVar9 < 65536.0) {
          fVar2 = fVar9;
        }
        pfVar8[-4] = (float)((int)*psVar7 & 0x80000000U | (uint)fVar2);
        fVar9 = (float)(((int)psVar7[-1] & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar9 | 0x7f800000);
        if (fVar9 < 65536.0) {
          fVar2 = fVar9;
        }
        pfVar8[-3] = (float)((int)psVar7[-1] & 0x80000000U | (uint)fVar2);
        fVar9 = (float)(((int)psVar7[-2] & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar9 | 0x7f800000);
        if (fVar9 < 65536.0) {
          fVar2 = fVar9;
        }
        pfVar8[-2] = (float)((int)psVar7[-2] & 0x80000000U | (uint)fVar2);
        fVar9 = (float)(((int)psVar7[-3] & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar9 | 0x7f800000);
        if (fVar9 < 65536.0) {
          fVar2 = fVar9;
        }
        pfVar8[-1] = (float)((int)psVar7[-3] & 0x80000000U | (uint)fVar2);
        pfVar8 = pfVar8 + 4;
        psVar7 = psVar7 + 4;
      } while (pfVar8 <= pfVar1);
    }
  }
  else {
    pauVar6 = (undefined1 (*) [16])inputp;
    do {
      do {
        auVar16 = *pauVar6;
        uVar19 = auVar16._4_2_;
        auVar3._10_2_ = uVar19;
        auVar3._0_10_ = (unkuint10)0;
        uVar18 = auVar16._2_2_;
        auVar28._2_12_ = SUB1612(ZEXT616(CONCAT42(auVar3._8_4_,uVar18)) << 0x30,4);
        auVar28._0_2_ = auVar16._0_2_;
        auVar28._14_2_ = 0;
        uVar21 = auVar16._8_2_;
        uVar23 = auVar16._10_2_;
        auVar27._0_10_ = (unkuint10)CONCAT24(uVar23,(uint)uVar21) << 0x10;
        uVar24 = auVar16._12_2_;
        auVar27._10_2_ = uVar24;
        auVar27._12_2_ = 0;
        uVar26 = auVar16._14_2_;
        auVar27._14_2_ = uVar26;
        auVar15._0_12_ = auVar16._0_12_;
        auVar15._12_2_ = auVar16._6_2_;
        auVar15._14_2_ = auVar16._6_2_;
        auVar14._12_4_ = auVar15._12_4_;
        auVar14._0_10_ = auVar16._0_10_;
        auVar14._10_2_ = uVar19;
        auVar13._10_6_ = auVar14._10_6_;
        auVar13._0_8_ = auVar16._0_8_;
        auVar13._8_2_ = uVar19;
        auVar16._8_8_ = auVar13._8_8_;
        auVar16._6_2_ = uVar18;
        auVar16._4_2_ = uVar18;
        auVar16._2_2_ = auVar16._0_2_;
        auVar16 = auVar16 & auVar5;
        iVar12 = auVar16._0_4_;
        iVar20 = auVar16._4_4_;
        iVar22 = auVar16._8_4_;
        iVar25 = auVar16._12_4_;
        auVar17._0_4_ = iVar12 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar12) & 0x38000000);
        auVar17._4_4_ = iVar20 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar20) & 0x38000000);
        auVar17._8_4_ = iVar22 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar22) & 0x38000000);
        auVar17._12_4_ = iVar25 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar25) & 0x38000000);
        auVar30._0_4_ = -(uint)(0x3ff < iVar12);
        auVar30._4_4_ = -(uint)(0x3ff < iVar20);
        auVar30._8_4_ = -(uint)(0x3ff < iVar22);
        auVar30._12_4_ = -(uint)(0x3ff < iVar25);
        auVar32._0_4_ = (float)(iVar12 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar32._4_4_ = (float)(iVar20 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar32._8_4_ = (float)(iVar22 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar32._12_4_ = (float)(iVar25 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar16 = auVar28 << 0x10 & auVar4 | auVar17 & auVar30 | ~auVar30 & auVar32;
        auVar10._2_2_ = uVar21;
        auVar10._0_2_ = uVar21;
        auVar10._4_2_ = uVar23;
        auVar10._6_2_ = uVar23;
        auVar10._8_2_ = uVar24;
        auVar10._10_2_ = uVar24;
        auVar10._12_2_ = uVar26;
        auVar10._14_2_ = uVar26;
        auVar10 = auVar10 & auVar5;
        iVar12 = auVar10._0_4_;
        iVar20 = auVar10._4_4_;
        iVar22 = auVar10._8_4_;
        iVar25 = auVar10._12_4_;
        auVar29._0_4_ = -(uint)(0x3ff < iVar12);
        auVar29._4_4_ = -(uint)(0x3ff < iVar20);
        auVar29._8_4_ = -(uint)(0x3ff < iVar22);
        auVar29._12_4_ = -(uint)(0x3ff < iVar25);
        auVar11._0_4_ = iVar12 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar12) & 0x38000000);
        auVar11._4_4_ = iVar20 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar20) & 0x38000000);
        auVar11._8_4_ = iVar22 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar22) & 0x38000000);
        auVar11._12_4_ = iVar25 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar25) & 0x38000000);
        auVar31._0_4_ = (float)(iVar12 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar31._4_4_ = (float)(iVar20 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar31._8_4_ = (float)(iVar22 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar31._12_4_ = (float)(iVar25 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar28 = auVar27 & auVar4 | auVar11 & auVar29 | ~auVar29 & auVar31;
        *decodep = auVar16._12_4_;
        decodep[1] = auVar16._8_4_;
        decodep[2] = auVar16._4_4_;
        decodep[3] = auVar16._0_4_;
        decodep[4] = auVar28._12_4_;
        decodep[5] = auVar28._8_4_;
        decodep[6] = auVar28._4_4_;
        decodep[7] = auVar28._0_4_;
        pfVar8 = decodep + 8;
        pauVar6 = pauVar6 + 1;
        decodep = pfVar8;
      } while (pfVar8 <= pfVar1 + -8);
      pauVar6 = (undefined1 (*) [16])((long)inputp + (long)width_times_channels * 2 + -0x10);
      decodep = pfVar1 + -8;
    } while (pfVar8 != pfVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_half_float_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  stbir__FP16 const * input = (stbir__FP16 const *)inputp;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    stbir__FP16 const * end_input_m8 = input + width_times_channels - 8;
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_NO_UNROLL(decode);

      stbir__half_to_float_SIMD( decode, input );
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, decode );
        stbir__decode_simdf8_flip( of );
        stbir__simdf8_store( decode, of );
      }
      #else
      {
        stbir__simdf of0,of1;
        stbir__simdf_load( of0, decode );
        stbir__simdf_load( of1, decode+4 );
        stbir__decode_simdf4_flip( of0 );
        stbir__decode_simdf4_flip( of1 );
        stbir__simdf_store( decode, of0 );
        stbir__simdf_store( decode+4, of1 );
      }
      #endif
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = stbir__half_to_float(input[stbir__decode_order0]);
    decode[1-4] = stbir__half_to_float(input[stbir__decode_order1]);
    decode[2-4] = stbir__half_to_float(input[stbir__decode_order2]);
    decode[3-4] = stbir__half_to_float(input[stbir__decode_order3]);
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = stbir__half_to_float(input[stbir__decode_order0]);
    #if stbir__coder_min_num >= 2
    decode[1] = stbir__half_to_float(input[stbir__decode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = stbir__half_to_float(input[stbir__decode_order2]);
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}